

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearSpeed::Update
          (ChLinkMotorLinearSpeed *this,double mytime,bool update_assets)

{
  long lVar1;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  lVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows;
  if (this->avoid_position_drift == true) {
    if (lVar1 < 1) {
LAB_005bb7dc:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                   );
    }
    (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         ((this->super_ChLinkMotorLinear).mpos - this->aux_dt) -
         *(double *)&(this->super_ChLinkMotorLinear).field_0x278;
  }
  else {
    if (lVar1 < 1) goto LAB_005bb7dc;
    (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  }
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Add the time-dependent term in residual C as
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A- x_pos_B, and d_setpoint = x(t)
    if (this->avoid_position_drift)
        C(0) = this->mpos - aux_dt - this->pos_offset;
    else
        C(0) = 0.0;
}